

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delete.cpp
# Opt level: O0

SinkResultType __thiscall
duckdb::PhysicalDelete::Sink
          (PhysicalDelete *this,ExecutionContext *context,DataChunk *chunk,OperatorSinkInput *input)

{
  bool bVar1;
  idx_t iVar2;
  anon_class_24_3_290736e8 *callback;
  ColumnFetchState *this_00;
  DataChunk *in_RDX;
  long in_RDI;
  reference rVar3;
  IndexAppendInfo index_append_info;
  optional_ptr<duckdb::LocalTableStorage,_true> storage_1;
  LocalStorage *local_storage_1;
  idx_t i_2;
  idx_t fetch_idx;
  ColumnFetchState fetch_state;
  DataChunk fetch_chunk;
  idx_t i_1;
  StorageIndex *col_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<duckdb::StorageIndex,_true> *__range2_1;
  unsigned_long *col;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  indexed_column_id_set;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  LocalStorage *local_storage;
  idx_t i;
  vector<duckdb::LogicalType,_true> column_types;
  vector<duckdb::StorageIndex,_true> column_ids;
  vector<bool,_true> to_be_fetched;
  vector<duckdb::LogicalType,_true> types;
  lock_guard<std::mutex> delete_guard;
  value_type *row_ids;
  DuckTransaction *transaction;
  DeleteLocalState *l_state;
  DeleteGlobalState *g_state;
  AttachedDatabase *in_stack_fffffffffffffba8;
  AttachedDatabase *db;
  ClientContext *in_stack_fffffffffffffbb0;
  __normal_iterator<duckdb::StorageIndex_*,_std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>_>
  in_stack_fffffffffffffbb8;
  __normal_iterator<duckdb::StorageIndex_*,_std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>_>
  in_stack_fffffffffffffbc0;
  DataTable *in_stack_fffffffffffffbf8;
  Vector *in_stack_fffffffffffffc00;
  Allocator *in_stack_fffffffffffffc08;
  DataChunk *in_stack_fffffffffffffc10;
  DuckTransaction *in_stack_fffffffffffffc18;
  DataTable *in_stack_fffffffffffffc20;
  ColumnFetchState *in_stack_fffffffffffffc30;
  ulong uVar4;
  Value *in_stack_fffffffffffffd28;
  Vector *in_stack_fffffffffffffd30;
  optional_ptr<duckdb::BoundIndex,_true> local_2c8;
  IndexAppendInfo local_2c0;
  LocalTableStorage *local_2b0;
  LocalStorage *local_2a8;
  idx_t in_stack_fffffffffffffd88;
  Vector *in_stack_fffffffffffffd90;
  ClientContext *in_stack_fffffffffffffd98;
  TableDeleteState *in_stack_fffffffffffffda0;
  DataTable *in_stack_fffffffffffffda8;
  reference local_248;
  ulong local_238;
  long local_230;
  undefined1 local_228 [144];
  reference local_198;
  __node_base local_188;
  reference local_180;
  StorageIndex *local_178;
  __normal_iterator<duckdb::StorageIndex_*,_std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>_>
  local_170;
  __node_base *local_168;
  __uniq_ptr_data<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true,_true>
  local_160;
  optional_ptr<duckdb::CatalogEntry,_true> local_158;
  DatabaseInstance *local_150;
  _Node_iterator_base<unsigned_long,_false> local_148;
  _Node_iterator_base<unsigned_long,_false> local_140;
  tuple<duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_> local_138;
  undefined1 *local_130;
  undefined1 local_128 [56];
  LocalTableStorage *local_f0;
  LocalStorage *local_e8;
  ulong local_e0;
  __node_base local_c0 [3];
  idx_t in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  undefined4 local_60;
  reference local_48;
  DuckTransaction *local_40;
  DeleteLocalState *local_38;
  DeleteGlobalState *local_30;
  DataChunk *local_20;
  SinkResultType local_1;
  
  local_20 = in_RDX;
  local_30 = GlobalSinkState::Cast<duckdb::DeleteGlobalState>
                       ((GlobalSinkState *)in_stack_fffffffffffffbb0);
  local_38 = LocalSinkState::Cast<duckdb::DeleteLocalState>
                       ((LocalSinkState *)in_stack_fffffffffffffbb0);
  local_40 = DuckTransaction::Get(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_48 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffbb0,
                        (size_type)in_stack_fffffffffffffba8);
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffbb0,
             (mutex_type *)in_stack_fffffffffffffba8);
  if (((*(byte *)(in_RDI + 0xb0) & 1) == 0) && ((local_30->has_unique_indexes & 1U) == 0)) {
    unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>::
    operator*((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
               *)in_stack_fffffffffffffbb0);
    DataChunk::size(local_20);
    iVar2 = DataTable::Delete(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                              in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                              in_stack_fffffffffffffd88);
    local_30->deleted_count = iVar2 + local_30->deleted_count;
    local_1 = NEED_MORE_INPUT;
    local_60 = 1;
  }
  else {
    DataTable::GetTypes(in_stack_fffffffffffffbf8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size(&local_78);
    ::std::allocator<bool>::allocator((allocator<bool> *)0x1869563);
    vector<bool,_true>::vector
              ((vector<bool,_true> *)in_stack_fffffffffffffbc0._M_current,
               (size_type)in_stack_fffffffffffffbb8._M_current,(bool *)in_stack_fffffffffffffbb0,
               (allocator_type *)in_stack_fffffffffffffba8);
    ::std::allocator<bool>::~allocator((allocator<bool> *)0x1869597);
    vector<duckdb::StorageIndex,_true>::vector((vector<duckdb::StorageIndex,_true> *)0x18695a4);
    vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0x18695b1);
    if ((*(byte *)(in_RDI + 0xb0) & 1) == 0) {
      local_e8 = LocalStorage::Get(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      local_f0 = (LocalTableStorage *)
                 LocalStorage::GetStorage
                           ((LocalStorage *)in_stack_fffffffffffffba8,(DataTable *)0x18696f8);
      ::std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)0x186971f);
      optional_ptr<duckdb::LocalTableStorage,_true>::operator->
                ((optional_ptr<duckdb::LocalTableStorage,_true> *)in_stack_fffffffffffffbb0);
      local_130 = local_128;
      TableIndexList::
      Scan<duckdb::PhysicalDelete::Sink(duckdb::ExecutionContext&,duckdb::DataChunk&,duckdb::OperatorSinkInput&)const::__0>
                ((TableIndexList *)in_stack_fffffffffffffc00,
                 (anon_class_8_1_ad86be99 *)in_stack_fffffffffffffbf8);
      local_138.
      super__Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
      .super__Head_base<0UL,_duckdb::TransactionManager_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::TransactionManager_*,_std::default_delete<duckdb::TransactionManager>_>
            )local_128;
      local_140._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::begin((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)in_stack_fffffffffffffba8);
      local_148._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  *)in_stack_fffffffffffffba8);
      while (bVar1 = ::std::__detail::operator!=(&local_140,&local_148), bVar1) {
        local_150 = (DatabaseInstance *)
                    ::std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
                              ((_Node_iterator<unsigned_long,_true,_false> *)0x18697c3);
        ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
        emplace_back<unsigned_long_const&>
                  ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
                   in_stack_fffffffffffffbc0._M_current,
                   &(in_stack_fffffffffffffbb8._M_current)->index);
        ::std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
                  ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_fffffffffffffbb0);
      }
      local_158.ptr =
           (CatalogEntry *)
           ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::begin
                     ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
                      in_stack_fffffffffffffba8);
      local_160.
      super___uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>.
      super__Head_base<0UL,_duckdb::CatalogEntry_*,_false>._M_head_impl =
           (__uniq_ptr_impl<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
           ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::end
                     ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
                      in_stack_fffffffffffffba8);
      ::std::
      sort<__gnu_cxx::__normal_iterator<duckdb::StorageIndex*,std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>>>
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
      local_168 = local_c0;
      local_170._M_current =
           (StorageIndex *)
           ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::begin
                     ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
                      in_stack_fffffffffffffba8);
      local_178 = (StorageIndex *)
                  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::end
                            ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
                             in_stack_fffffffffffffba8);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<duckdb::StorageIndex_*,_std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>_>
                            *)in_stack_fffffffffffffbb0,
                           (__normal_iterator<duckdb::StorageIndex_*,_std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>_>
                            *)in_stack_fffffffffffffba8);
        if (!bVar1) break;
        local_180 = __gnu_cxx::
                    __normal_iterator<duckdb::StorageIndex_*,_std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>_>
                    ::operator*(&local_170);
        local_188._M_nxt = (_Hash_node_base *)StorageIndex::GetPrimaryIndex(local_180);
        rVar3 = vector<bool,_true>::operator[]
                          ((vector<bool,_true> *)in_stack_fffffffffffffbb0,
                           (size_type)in_stack_fffffffffffffba8);
        local_198 = rVar3;
        ::std::_Bit_reference::operator=((_Bit_reference *)&local_198,true);
        vector<duckdb::LogicalType,_true>::operator[]
                  ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffbb0,
                   (size_type)in_stack_fffffffffffffba8);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   in_stack_fffffffffffffbc0._M_current,
                   (value_type *)in_stack_fffffffffffffbb8._M_current);
        __gnu_cxx::
        __normal_iterator<duckdb::StorageIndex_*,_std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>_>
        ::operator++(&local_170);
      }
      ::std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)0x18699a6);
    }
    else {
      vector<duckdb::LogicalType,_true>::operator=
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffbb0,
                 (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffba8);
      local_e0 = 0;
      while( true ) {
        uVar4 = local_e0;
        iVar2 = DataTable::ColumnCount((DataTable *)0x186960d);
        if (iVar2 <= uVar4) break;
        ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
        emplace_back<unsigned_long&>
                  ((vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> *)
                   in_stack_fffffffffffffbc0._M_current,
                   &(in_stack_fffffffffffffbb8._M_current)->index);
        local_e0 = local_e0 + 1;
      }
    }
    DataChunk::Reset(in_stack_fffffffffffffc10);
    DataChunk::size(local_20);
    Vector::Flatten(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    DataChunk::DataChunk((DataChunk *)in_stack_fffffffffffffbb0);
    Allocator::Get((ClientContext *)0x1869a16);
    DataChunk::size(local_20);
    DataChunk::Initialize
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
               (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffc00,
               (idx_t)in_stack_fffffffffffffbf8);
    local_228[0x40] = false;
    local_228[0x41] = false;
    local_228[0x42] = false;
    local_228._67_5_ = 0;
    local_228._72_8_ = 0;
    local_228._48_8_ = 0;
    local_228._56_8_ = 0;
    local_228._32_8_ = 0;
    local_228._40_8_ = 0;
    local_228._16_8_ = 0;
    local_228._24_8_ = (CatalogSet *)0x0;
    local_228._0_8_ = (_func_int **)0x0;
    local_228._8_8_ = 0;
    ColumnFetchState::ColumnFetchState((ColumnFetchState *)in_stack_fffffffffffffbb0);
    DataChunk::size(local_20);
    db = (AttachedDatabase *)local_228;
    DataTable::Fetch(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                     (vector<duckdb::StorageIndex,_true> *)in_stack_fffffffffffffc08,
                     in_stack_fffffffffffffc00,(idx_t)in_stack_fffffffffffffbf8,
                     in_stack_fffffffffffffc30);
    local_230 = 0;
    local_238 = 0;
    while( true ) {
      uVar4 = local_238;
      iVar2 = DataTable::ColumnCount((DataTable *)0x1869b65);
      if (iVar2 <= uVar4) break;
      rVar3 = vector<bool,_true>::operator[]
                        ((vector<bool,_true> *)in_stack_fffffffffffffbb0,(size_type)db);
      in_stack_fffffffffffffc20 = (DataTable *)rVar3._M_mask;
      local_248 = rVar3;
      bVar1 = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&local_248);
      if (bVar1) {
        in_stack_fffffffffffffc18 =
             (DuckTransaction *)
             vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffbb0,(size_type)db);
        local_230 = local_230 + 1;
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffbb0,(size_type)db);
        Vector::Reference(in_stack_fffffffffffffc00,(Vector *)in_stack_fffffffffffffbf8);
      }
      else {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffffbb0,(size_type)db);
        in_stack_fffffffffffffc00 =
             (Vector *)
             vector<duckdb::LogicalType,_true>::operator[]
                       ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffbb0,(size_type)db
                       );
        LogicalType::LogicalType((LogicalType *)in_stack_fffffffffffffbb0,(LogicalType *)db);
        Value::Value((Value *)in_stack_fffffffffffffbc0._M_current,
                     (LogicalType *)in_stack_fffffffffffffbb8._M_current);
        Vector::Reference(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        Value::~Value((Value *)in_stack_fffffffffffffbb0);
        LogicalType::~LogicalType((LogicalType *)0x1869d06);
      }
      local_238 = local_238 + 1;
    }
    DataChunk::SetCardinality((DataChunk *)in_stack_fffffffffffffbb0,(DataChunk *)db);
    if ((local_30->has_unique_indexes & 1U) != 0) {
      callback = (anon_class_24_3_290736e8 *)DataChunk::size(&local_38->delete_chunk);
      if (callback != (anon_class_24_3_290736e8 *)0x0) {
        local_2a8 = LocalStorage::Get(in_stack_fffffffffffffbb0,db);
        local_2b0 = (LocalTableStorage *)
                    LocalStorage::GetStorage((LocalStorage *)db,(DataTable *)0x1869e12);
        optional_ptr<duckdb::BoundIndex,_true>::optional_ptr(&local_2c8,(BoundIndex *)0x0);
        IndexAppendInfo::IndexAppendInfo(&local_2c0,IGNORE_DUPLICATES,local_2c8);
        optional_ptr<duckdb::LocalTableStorage,_true>::operator->
                  ((optional_ptr<duckdb::LocalTableStorage,_true> *)in_stack_fffffffffffffbb0);
        TableIndexList::
        Scan<duckdb::PhysicalDelete::Sink(duckdb::ExecutionContext&,duckdb::DataChunk&,duckdb::OperatorSinkInput&)const::__1>
                  ((TableIndexList *)in_stack_fffffffffffffc00,callback);
      }
    }
    if ((*(byte *)(in_RDI + 0xb0) & 1) != 0) {
      ColumnDataCollection::Append
                ((ColumnDataCollection *)in_stack_fffffffffffffc20,
                 (DataChunk *)in_stack_fffffffffffffc18);
    }
    unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>::
    operator*((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
               *)in_stack_fffffffffffffbb0);
    DataChunk::size(local_20);
    this_00 = (ColumnFetchState *)
              DataTable::Delete(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                                in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                in_stack_fffffffffffffd88);
    local_30->deleted_count = (long)&(this_00->handles)._M_h._M_buckets + local_30->deleted_count;
    local_1 = NEED_MORE_INPUT;
    local_60 = 1;
    ColumnFetchState::~ColumnFetchState(this_00);
    DataChunk::~DataChunk((DataChunk *)this_00);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1869fbf);
    vector<duckdb::StorageIndex,_true>::~vector((vector<duckdb::StorageIndex,_true> *)0x1869fcc);
    vector<bool,_true>::~vector((vector<bool,_true> *)0x1869fd9);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1869fe6);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x186a045);
  return local_1;
}

Assistant:

SinkResultType PhysicalDelete::Sink(ExecutionContext &context, DataChunk &chunk, OperatorSinkInput &input) const {
	auto &g_state = input.global_state.Cast<DeleteGlobalState>();
	auto &l_state = input.local_state.Cast<DeleteLocalState>();

	auto &transaction = DuckTransaction::Get(context.client, table.db);
	auto &row_ids = chunk.data[row_id_index];

	lock_guard<mutex> delete_guard(g_state.delete_lock);
	if (!return_chunk && !g_state.has_unique_indexes) {
		g_state.deleted_count += table.Delete(*l_state.delete_state, context.client, row_ids, chunk.size());
		return SinkResultType::NEED_MORE_INPUT;
	}

	auto types = table.GetTypes();
	auto to_be_fetched = vector<bool>(types.size(), return_chunk);
	vector<StorageIndex> column_ids;
	vector<LogicalType> column_types;
	if (return_chunk) {
		// Fetch all columns.
		column_types = types;
		for (idx_t i = 0; i < table.ColumnCount(); i++) {
			column_ids.emplace_back(i);
		}

	} else {
		// Fetch only the required columns for updating the delete indexes.
		auto &local_storage = LocalStorage::Get(context.client, table.db);
		auto storage = local_storage.GetStorage(table);
		unordered_set<column_t> indexed_column_id_set;
		storage->delete_indexes.Scan([&](Index &index) {
			if (!index.IsBound() || !index.IsUnique()) {
				return false;
			}
			auto &set = index.GetColumnIdSet();
			indexed_column_id_set.insert(set.begin(), set.end());
			return false;
		});
		for (auto &col : indexed_column_id_set) {
			column_ids.emplace_back(col);
		}
		sort(column_ids.begin(), column_ids.end());
		for (auto &col : column_ids) {
			auto i = col.GetPrimaryIndex();
			to_be_fetched[i] = true;
			column_types.push_back(types[i]);
		}
	}

	l_state.delete_chunk.Reset();
	row_ids.Flatten(chunk.size());

	// Fetch the to-be-deleted chunk.
	DataChunk fetch_chunk;
	fetch_chunk.Initialize(Allocator::Get(context.client), column_types, chunk.size());
	auto fetch_state = ColumnFetchState();
	table.Fetch(transaction, fetch_chunk, column_ids, row_ids, chunk.size(), fetch_state);

	// Reference the necessary columns of the fetch_chunk.
	idx_t fetch_idx = 0;
	for (idx_t i = 0; i < table.ColumnCount(); i++) {
		if (to_be_fetched[i]) {
			l_state.delete_chunk.data[i].Reference(fetch_chunk.data[fetch_idx++]);
			continue;
		}
		l_state.delete_chunk.data[i].Reference(Value(types[i]));
	}
	l_state.delete_chunk.SetCardinality(fetch_chunk);

	// Append the deleted row IDs to the delete indexes.
	// If we only delete local row IDs, then the delete_chunk is empty.
	if (g_state.has_unique_indexes && l_state.delete_chunk.size() != 0) {
		auto &local_storage = LocalStorage::Get(context.client, table.db);
		auto storage = local_storage.GetStorage(table);
		IndexAppendInfo index_append_info(IndexAppendMode::IGNORE_DUPLICATES, nullptr);
		storage->delete_indexes.Scan([&](Index &index) {
			if (!index.IsBound() || !index.IsUnique()) {
				return false;
			}
			auto &bound_index = index.Cast<BoundIndex>();
			auto error = bound_index.Append(l_state.delete_chunk, row_ids, index_append_info);
			if (error.HasError()) {
				throw InternalException("failed to update delete ART in physical delete: ", error.Message());
			}
			return false;
		});
	}

	// Append the return_chunk to the return collection.
	if (return_chunk) {
		g_state.return_collection.Append(l_state.delete_chunk);
	}

	g_state.deleted_count += table.Delete(*l_state.delete_state, context.client, row_ids, chunk.size());
	return SinkResultType::NEED_MORE_INPUT;
}